

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdi::ControllerWidget::ControllerWidget(ControllerWidget *this,QWidget *parent)

{
  long lVar1;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  Policy in_stack_ffffffffffffffb8;
  FocusPolicy in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x62b196);
  QWidget::QWidget(in_RDI,(QWidget *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (WindowFlags)in_stack_ffffffffffffffdc.i);
  *(undefined ***)in_RDI = &PTR_metaObject_00d17030;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__ControllerWidget_00d171e0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)&in_RDI[1].field_0x4 = 0;
  QFlags<QStyle::SubControl>::QFlags((QFlags<QStyle::SubControl> *)in_RSI,in_stack_ffffffffffffffbc)
  ;
  QWidget::setFocusPolicy(in_RSI,in_stack_ffffffffffffffbc);
  QWidget::setSizePolicy(in_RSI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  QWidget::setMouseTracking(in_RSI,SUB41(in_stack_ffffffffffffffbc >> 0x18,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ControllerWidget::ControllerWidget(QWidget *parent)
    : QWidget(parent),
      activeControl(QStyle::SC_None),
      hoverControl(QStyle::SC_None),
      visibleControls(QStyle::SC_None)
{
    setFocusPolicy(Qt::NoFocus);
    setSizePolicy(QSizePolicy::Minimum, QSizePolicy::Minimum);
    setMouseTracking(true);
}